

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type __thiscall
duckdb::Deserializer::Read<duckdb::shared_ptr<duckdb::ColumnDataCollection,true>>
          (Deserializer *this)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Deserializer *in_RSI;
  type tVar2;
  
  this->_vptr_Deserializer = (_func_int **)0x0;
  *(undefined8 *)&this->deserialize_enum_from_string = 0;
  iVar1 = (*in_RSI->_vptr_Deserializer[10])();
  if ((char)iVar1 != '\0') {
    (*in_RSI->_vptr_Deserializer[6])();
    ColumnDataCollection::Deserialize((ColumnDataCollection *)&stack0xffffffffffffffe8,in_RSI);
    shared_ptr<duckdb::ColumnDataCollection,_true>::
    operator=<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_0>
              ((shared_ptr<duckdb::ColumnDataCollection,_true> *)this,
               (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)&stack0xffffffffffffffe8);
    ::std::
    unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                 *)&stack0xffffffffffffffe8);
    (*in_RSI->_vptr_Deserializer[7])();
  }
  (*in_RSI->_vptr_Deserializer[0xb])();
  tVar2.internal.super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  tVar2.internal.super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (type)tVar2.internal.
               super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline typename std::enable_if<is_shared_ptr<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_shared_ptr<T>::ELEMENT_TYPE;
		shared_ptr<ELEMENT_TYPE> ptr = nullptr;
		auto is_present = OnNullableBegin();
		if (is_present) {
			OnObjectBegin();
			ptr = ELEMENT_TYPE::Deserialize(*this);
			OnObjectEnd();
		}
		OnNullableEnd();
		return ptr;
	}